

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_zero_output(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t *puVar2;
  internal_state_conflict *state;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = strm->avail_out;
  piVar1 = strm->state;
  uVar4 = (ulong)piVar1->bytes_per_sample;
  do {
    if (uVar3 < uVar4) {
      return 0;
    }
    puVar2 = piVar1->rsip;
    piVar1->rsip = puVar2 + 1;
    *puVar2 = 0;
    uVar4 = (ulong)piVar1->bytes_per_sample;
    uVar3 = uVar3 - uVar4;
    strm->avail_out = uVar3;
    puVar2 = &piVar1->sample_counter;
    *puVar2 = *puVar2 - 1;
  } while (*puVar2 != 0);
  piVar1->mode = m_next_cds;
  return 1;
}

Assistant:

static int m_zero_output(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, 0);
    } while(--state->sample_counter);

    state->mode = m_next_cds;
    return M_CONTINUE;
}